

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_address.c
# Opt level: O3

char * cmime_address_to_string(CMimeAddress_T *ca)

{
  char *__fmt;
  char *local_10;
  char *s;
  
  local_10 = (char *)0x0;
  if (ca != (CMimeAddress_T *)0x0) {
    if (ca->name == (char *)0x0) {
      asprintf(&local_10,"%s",ca->email);
    }
    else {
      if (ca->parsed == 1) {
        __fmt = "%s%s";
      }
      else {
        __fmt = "%s %s";
      }
      asprintf(&local_10,__fmt,ca->name,ca->email);
    }
    return local_10;
  }
  __assert_fail("ca",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_address.c"
                ,0x41,"char *cmime_address_to_string(CMimeAddress_T *)");
}

Assistant:

char *cmime_address_to_string(CMimeAddress_T *ca) {
    char *s = NULL;
    
    assert(ca);
    if(ca->name != NULL) {
        if (ca->parsed==1) 
            asprintf(&s,"%s%s",ca->name,ca->email);
        else
            asprintf(&s,"%s %s",ca->name,ca->email);
    } else {
        asprintf(&s,"%s",ca->email);
    }
    
    return(s);
}